

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetTreeForNested
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  const_iterator cVar1;
  ParseInfoTree *pPVar2;
  FieldDescriptor *local_20;
  
  local_20 = field;
  CheckFieldIndex(field,index);
  cVar1 = std::
          _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
          ::find(&(this->nested_)._M_t,&local_20);
  pPVar2 = (ParseInfoTree *)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->nested_)._M_t._M_impl.super__Rb_tree_header) {
    if (index == -1) {
      index = 0;
    }
    if ((ulong)(long)index <
        (ulong)((long)cVar1._M_node[1]._M_left - (long)cVar1._M_node[1]._M_parent >> 3)) {
      pPVar2 = *(ParseInfoTree **)(&(cVar1._M_node[1]._M_parent)->_M_color + (long)index * 2);
    }
  }
  return pPVar2;
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::GetTreeForNested(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) {
    index = 0;
  }

  auto it = nested_.find(field);
  if (it == nested_.end() || index >= it->second.size()) {
    return nullptr;
  }

  return it->second[index].get();
}